

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O2

bool __thiscall
iDynTree::KinDynComputations::getFrameFreeFloatingJacobian
          (KinDynComputations *this,FrameIndex frameIndex,MatrixDynSize *outJacobian)

{
  bool bVar1;
  MatrixStorageOrdering local_4c;
  MatrixView<double> local_48;
  
  local_4c = RowMajor;
  MatrixView<double>::MatrixView<iDynTree::MatrixDynSize,_0>(&local_48,outJacobian,&local_4c);
  bVar1 = getFrameFreeFloatingJacobian(this,frameIndex,&local_48);
  return bVar1;
}

Assistant:

bool KinDynComputations::getFrameFreeFloatingJacobian(const FrameIndex frameIndex,
                                                      MatrixDynSize& outJacobian)
{
    return getFrameFreeFloatingJacobian(frameIndex, MatrixView<double>(outJacobian));
}